

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O2

void auxsort(lua_State *L,IdxT lo,IdxT up,uint rnd)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint j;
  ulong n;
  
  do {
    uVar3 = up - lo;
    if (up < lo || uVar3 == 0) {
      return;
    }
    lua_geti(L,1,(ulong)lo);
    lua_geti(L,1,(ulong)up);
    iVar1 = sort_comp(L,-1,-2);
    if (iVar1 == 0) {
      lua_settop(L,-3);
    }
    else {
      set2(L,lo,up);
    }
    if (uVar3 == 1) {
      return;
    }
    if (uVar3 < 100 || rnd == 0) {
      uVar2 = up + lo >> 1;
    }
    else {
      uVar2 = (uVar3 >> 2) + lo + (up ^ lo ^ rnd) % ((uVar3 >> 2) * 2);
    }
    lua_geti(L,1,(ulong)uVar2);
    lua_geti(L,1,(ulong)lo);
    iVar1 = sort_comp(L,-2,-1);
    uVar4 = lo;
    if (iVar1 == 0) {
      lua_settop(L,-2);
      lua_geti(L,1,(ulong)up);
      iVar1 = sort_comp(L,-1,-2);
      uVar4 = up;
      if (iVar1 != 0) goto LAB_0011a49a;
      lua_settop(L,-3);
    }
    else {
LAB_0011a49a:
      set2(L,uVar2,uVar4);
    }
    if (uVar3 == 2) {
      return;
    }
    lua_geti(L,1,(ulong)uVar2);
    lua_pushvalue(L,-1);
    uVar3 = up - 1;
    n = (ulong)uVar3;
    lua_geti(L,1,n);
    set2(L,uVar2,uVar3);
    uVar2 = lo;
    while( true ) {
      while( true ) {
        lua_geti(L,1,(ulong)(uVar2 + 1));
        iVar1 = sort_comp(L,-1,-2);
        if (iVar1 == 0) break;
        if (up - 2 == uVar2) {
          luaL_error(L,"invalid order function for sorting");
        }
        lua_settop(L,-2);
        uVar2 = uVar2 + 1;
      }
      uVar4 = uVar2 + 1;
      j = (uint)n;
      while( true ) {
        j = j - 1;
        n = (ulong)j;
        lua_geti(L,1,n);
        iVar1 = sort_comp(L,-3,-1);
        if (iVar1 == 0) break;
        if (j < uVar4) {
          luaL_error(L,"invalid order function for sorting");
        }
        lua_settop(L,-2);
      }
      if (j < uVar4) break;
      set2(L,uVar4,j);
      uVar2 = uVar4;
    }
    lua_settop(L,-2);
    set2(L,uVar3,uVar2 + 1);
    uVar4 = (uVar2 - lo) + 1;
    uVar3 = uVar3 - uVar2;
    if (uVar4 < uVar3) {
      auxsort(L,lo,uVar2,rnd);
      lo = uVar2 + 2;
      uVar3 = uVar4;
    }
    else {
      auxsort(L,uVar2 + 2,up,rnd);
      up = uVar2;
    }
    if (uVar3 < up - lo >> 7) {
      rnd = luaL_makeseed(L);
    }
  } while( true );
}

Assistant:

static void auxsort (lua_State *L, IdxT lo, IdxT up, unsigned rnd) {
  while (lo < up) {  /* loop for tail recursion */
    IdxT p;  /* Pivot index */
    IdxT n;  /* to be used later */
    /* sort elements 'lo', 'p', and 'up' */
    geti(L, 1, lo);
    geti(L, 1, up);
    if (sort_comp(L, -1, -2))  /* a[up] < a[lo]? */
      set2(L, lo, up);  /* swap a[lo] - a[up] */
    else
      lua_pop(L, 2);  /* remove both values */
    if (up - lo == 1)  /* only 2 elements? */
      return;  /* already sorted */
    if (up - lo < RANLIMIT || rnd == 0)  /* small interval or no randomize? */
      p = (lo + up)/2;  /* middle element is a good pivot */
    else  /* for larger intervals, it is worth a random pivot */
      p = choosePivot(lo, up, rnd);
    geti(L, 1, p);
    geti(L, 1, lo);
    if (sort_comp(L, -2, -1))  /* a[p] < a[lo]? */
      set2(L, p, lo);  /* swap a[p] - a[lo] */
    else {
      lua_pop(L, 1);  /* remove a[lo] */
      geti(L, 1, up);
      if (sort_comp(L, -1, -2))  /* a[up] < a[p]? */
        set2(L, p, up);  /* swap a[up] - a[p] */
      else
        lua_pop(L, 2);
    }
    if (up - lo == 2)  /* only 3 elements? */
      return;  /* already sorted */
    geti(L, 1, p);  /* get middle element (Pivot) */
    lua_pushvalue(L, -1);  /* push Pivot */
    geti(L, 1, up - 1);  /* push a[up - 1] */
    set2(L, p, up - 1);  /* swap Pivot (a[p]) with a[up - 1] */
    p = partition(L, lo, up);
    /* a[lo .. p - 1] <= a[p] == P <= a[p + 1 .. up] */
    if (p - lo < up - p) {  /* lower interval is smaller? */
      auxsort(L, lo, p - 1, rnd);  /* call recursively for lower interval */
      n = p - lo;  /* size of smaller interval */
      lo = p + 1;  /* tail call for [p + 1 .. up] (upper interval) */
    }
    else {
      auxsort(L, p + 1, up, rnd);  /* call recursively for upper interval */
      n = up - p;  /* size of smaller interval */
      up = p - 1;  /* tail call for [lo .. p - 1]  (lower interval) */
    }
    if ((up - lo) / 128 > n) /* partition too imbalanced? */
      rnd = l_randomizePivot(L);  /* try a new randomization */
  }  /* tail call auxsort(L, lo, up, rnd) */
}